

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STX.cpp
# Opt level: O0

void __thiscall Storage::Disk::STX::STX(STX *this,string *file_name)

{
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  undefined4 *puVar4;
  int *piVar5;
  uint local_40;
  uint local_3c;
  byte local_35;
  uint32_t local_34;
  uint8_t track_position;
  long lStack_30;
  uint32_t size;
  long offset;
  string *local_18;
  string *file_name_local;
  STX *this_local;
  
  local_18 = file_name;
  file_name_local = (string *)this;
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__STX_00caa7c0;
  FileHolder::FileHolder(&this->file_,local_18,ReadWrite);
  bVar1 = FileHolder::check_signature(&this->file_,"RSY",4);
  if (!bVar1) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0xfffffffe;
    __cxa_throw(puVar4,&Error::typeinfo,0);
  }
  uVar3 = FileHolder::get16le(&this->file_);
  if (uVar3 != 3) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0xfffffffe;
    __cxa_throw(puVar4,&Error::typeinfo,0);
  }
  FileHolder::seek(&this->file_,4,1);
  FileHolder::seek(&this->file_,1,1);
  uVar2 = FileHolder::get8(&this->file_);
  this->is_new_format_ = uVar2 == '\x02';
  FileHolder::seek(&this->file_,4,1);
  memset(this->offset_by_track_,0,0x800);
  this->track_count_ = 0;
  this->head_count_ = 1;
  while( true ) {
    lStack_30 = FileHolder::tell(&this->file_);
    local_34 = FileHolder::get32le(&this->file_);
    bVar1 = FileHolder::eof(&this->file_);
    if (bVar1) break;
    FileHolder::seek(&this->file_,10,1);
    local_35 = FileHolder::get8(&this->file_);
    this->offset_by_track_[local_35] = lStack_30;
    local_3c = local_35 & 0x7f;
    piVar5 = std::max<int>(&this->track_count_,(int *)&local_3c);
    this->track_count_ = *piVar5;
    local_40 = local_35 >> 6 & 0xfffffffe;
    piVar5 = std::max<int>(&this->head_count_,(int *)&local_40);
    this->head_count_ = *piVar5;
    FileHolder::seek(&this->file_,lStack_30 + (ulong)local_34,0);
  }
  return;
}

Assistant:

STX::STX(const std::string &file_name) : file_(file_name) {
	// Require that this be a version 3 Pasti.
	if(!file_.check_signature("RSY", 4)) throw Error::InvalidFormat;
	if(file_.get16le() != 3) throw Error::InvalidFormat;

	// Skip: tool used, 2 reserved bytes.
	file_.seek(4, SEEK_CUR);

	// Skip the track count, test for a new-style encoding, skip a reserved area.
	file_.seek(1, SEEK_CUR);
	is_new_format_ = file_.get8() == 2;
	file_.seek(4, SEEK_CUR);

	// Set all tracks absent.
	memset(offset_by_track_, 0, sizeof(offset_by_track_));

	// Parse the tracks table to fill in offset_by_track_. The only available documentation
	// for STX is unofficial and makes no promise about track order. Hence the bucket sort,
	// effectively putting them into track order.
	//
	//	Track descriptor layout:
	//
	//	0	4	Record size.
	//	4	4	Number of bytes in fuzzy mask record.
	//	8	2	Number of sectors on track.
	//	10	2	Track flags.
	//	12	2	Total number of bytes on track.
	//	14	1	Track number (b7 = side, b0-b6 = track).
	//	15	1	Track type.
	track_count_ = 0;
	head_count_ = 1;
	while(true) {
		const long offset = file_.tell();
		const uint32_t size = file_.get32le();
		if(file_.eof()) break;

		// Skip fields other than track position, then fill in table position and advance.
		file_.seek(10, SEEK_CUR);

		const uint8_t track_position = file_.get8();
		offset_by_track_[track_position] = offset;

		// Update the maximum surface dimensions.
		track_count_ = std::max(track_count_, track_position & 0x7f);
		head_count_ = std::max(head_count_, ((track_position & 0x80) >> 6));

		// Seek next track start.
		file_.seek(offset + size, SEEK_SET);
	}
}